

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioNative.cpp
# Opt level: O1

void chatra::emb::io::fileOutputStream_close(Ct *ct)

{
  int iVar1;
  FileOutputStreamData *pFVar2;
  
  pFVar2 = derefSelfAsOutput(ct);
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&pFVar2->mt);
  if (iVar1 == 0) {
    (*((pFVar2->file)._M_t.super___uniq_ptr_impl<chatra::IFile,_std::default_delete<chatra::IFile>_>
       ._M_t.super__Tuple_impl<0UL,_chatra::IFile_*,_std::default_delete<chatra::IFile>_>.
       super__Head_base<0UL,_chatra::IFile_*,_false>._M_head_impl)->_vptr_IFile[2])();
    pthread_mutex_unlock((pthread_mutex_t *)&pFVar2->mt);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

static void fileOutputStream_close(Ct& ct) {
	auto* self = derefSelfAsOutput(ct);
	std::lock_guard<std::mutex> lock(self->mt);
	self->file->close();
}